

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

Type * __thiscall
slang::ast::GenericClassDefSymbol::getSpecializationImpl
          (GenericClassDefSymbol *this,ASTContext *context,SourceLocation instanceLoc,
          bool forceInvalidParams,ParameterValueAssignmentSyntax *syntax)

{
  group_type_pointer pgVar1;
  SymbolIndex SVar2;
  ParameterSymbol *this_00;
  _func_void_intptr_t_Compilation_ptr_ClassType_ptr_SourceLocation *p_Var3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> parameterDecls;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  Diagnostic *this_01;
  ParameterSymbolBase *pPVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> src_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_04;
  ulong uVar15;
  long lVar16;
  GenericClassDefSymbol *pGVar17;
  Compilation *pCVar18;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
  *ptVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  Compilation *pCVar24;
  ClassType *pCVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  byte bVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  byte bVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  byte bVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  byte bVar43;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams_00;
  SourceRange referencingRange;
  span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues_00;
  SourceLocation in_stack_fffffffffffffcd8;
  try_emplace_args_t local_311;
  ClassType *classType;
  GenericClassDefSymbol *local_308;
  Compilation *local_300;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
  *local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  undefined8 local_2c8;
  uchar uStack_2c0;
  uchar uStack_2bf;
  uchar uStack_2be;
  byte bStack_2bd;
  uchar uStack_2bc;
  uchar uStack_2bb;
  uchar uStack_2ba;
  byte bStack_2b9;
  Compilation *local_2b0;
  ClassSpecializationKey key;
  locator local_280;
  uchar local_268;
  uchar uStack_267;
  uchar uStack_266;
  byte bStack_265;
  uchar uStack_264;
  uchar uStack_263;
  uchar uStack_262;
  byte bStack_261;
  uchar uStack_260;
  uchar uStack_25f;
  uchar uStack_25e;
  byte bStack_25d;
  uchar uStack_25c;
  uchar uStack_25b;
  uchar uStack_25a;
  byte bStack_259;
  uchar local_258;
  uchar uStack_257;
  uchar uStack_256;
  byte bStack_255;
  uchar uStack_254;
  uchar uStack_253;
  uchar uStack_252;
  byte bStack_251;
  uchar uStack_250;
  uchar uStack_24f;
  uchar uStack_24e;
  byte bStack_24d;
  uchar uStack_24c;
  uchar uStack_24b;
  uchar uStack_24a;
  byte bStack_249;
  SmallVector<const_slang::ast::Type_*,_5UL> typeParams;
  SmallVector<const_slang::ConstantValue_*,_5UL> paramValues;
  ParameterBuilder paramBuilder;
  
  pCVar24 = ((context->scope).ptr)->compilation;
  local_2b0 = (Compilation *)(this->super_Symbol).parentScope;
  uVar12 = this->recursionDepth + 1;
  this->recursionDepth = uVar12;
  if ((pCVar24->options).maxRecursiveClassSpecialization < uVar12) {
    this_01 = ASTContext::addDiag(context,(DiagCode)0x1f0009,instanceLoc);
    Diagnostic::operator<<(this_01,(this->super_Symbol).name);
    pCVar25 = (ClassType *)pCVar24->errorType;
    goto LAB_0064a331;
  }
  local_308 = this;
  classType = BumpAllocator::
              emplace<slang::ast::ClassType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                        (&pCVar24->super_BumpAllocator,pCVar24,&(this->super_Symbol).name,
                         &(this->super_Symbol).location);
  classType->genericClass = this;
  bVar10 = true;
  if (!forceInvalidParams) {
    bVar10 = Scope::isUninstantiated((context->scope).ptr);
  }
  classType->isUninstantiated = bVar10;
  SVar2 = (this->super_Symbol).indexInScope;
  (classType->super_Type).super_Symbol.parentScope = (Scope *)local_2b0;
  (classType->super_Type).super_Symbol.indexInScope = SVar2;
  parameterDecls._M_ptr =
       (this->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_;
  parameterDecls._M_extent._M_extent_value =
       (this->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len;
  ParameterBuilder::ParameterBuilder
            (&paramBuilder,(context->scope).ptr,(this->super_Symbol).name,parameterDecls);
  local_2f8 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
               *)CONCAT44(local_2f8._4_4_,(int)CONCAT71(in_register_00000009,forceInvalidParams));
  paramBuilder.suppressErrors = syntax == (ParameterValueAssignmentSyntax *)0x0;
  src = extraout_RDX;
  local_300 = pCVar24;
  paramBuilder.instanceContext = context;
  paramBuilder.forceInvalidValues = forceInvalidParams;
  if (!paramBuilder.suppressErrors) {
    ParameterBuilder::setAssignments(&paramBuilder,syntax,false);
    src = extraout_RDX_00;
  }
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.data_ =
       (pointer)paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.firstElement;
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.len = 0;
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.cap = 5;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.data_ =
       (pointer)typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.firstElement;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.len = 0;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.cap = 5;
  pCVar24 = (Compilation *)
            (this->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.
            data_;
  local_2c8 = syntax;
  for (lVar16 = (this->paramDecls).
                super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len << 6;
      pCVar18 = local_300, pGVar17 = local_308, lVar16 != 0; lVar16 = lVar16 + -0x40) {
    pCVar18 = pCVar24;
    pPVar14 = ParameterBuilder::createParam
                        (&paramBuilder,(ParameterDecl *)pCVar24,&classType->super_Scope,instanceLoc)
    ;
    if (paramBuilder.anyErrors == true) {
      this = local_308;
      if (local_2c8 == (ParameterValueAssignmentSyntax *)0x0) {
        pCVar25 = (ClassType *)0x0;
      }
      else {
        pCVar25 = (ClassType *)local_300->errorType;
      }
      goto LAB_0064a30a;
    }
    src = extraout_RDX_01;
    if (pPVar14->isLocal == false) {
      this_00 = (ParameterSymbol *)pPVar14->symbol;
      if ((this_00->super_ValueSymbol).super_Symbol.kind == Parameter) {
        referencingRange.endLoc =
             (SourceLocation)
             ((long)instanceLoc * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
             (ulong)(instanceLoc._0_4_ & 0xfffffff));
        referencingRange.startLoc = instanceLoc;
        key.paramValues._M_ptr = (pointer)ParameterSymbol::getValue(this_00,referencingRange);
        SmallVectorBase<slang::ConstantValue_const*>::emplace_back<slang::ConstantValue_const*>
                  ((SmallVectorBase<slang::ConstantValue_const*> *)&paramValues,
                   (ConstantValue **)&key);
        src = extraout_RDX_02;
      }
      else {
        key.paramValues._M_ptr =
             (pointer)DeclaredType::getType
                                ((DeclaredType *)
                                 &(this_00->super_ValueSymbol).declaredType.dimensions);
        SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                  ((SmallVectorBase<slang::ast::Type_const*> *)&typeParams,(Type **)&key);
        src = extraout_RDX_03;
      }
    }
    pCVar24 = (Compilation *)&(pCVar24->options).typoCorrectionLimit;
  }
  this = local_308;
  if ((char)local_2f8 == '\0') {
    iVar13 = SmallVectorBase<const_slang::ConstantValue_*>::copy
                       (&paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>,
                        (EVP_PKEY_CTX *)local_300,src);
    paramValues_00._M_ptr._4_4_ = extraout_var;
    paramValues_00._M_ptr._0_4_ = iVar13;
    iVar13 = SmallVectorBase<const_slang::ast::Type_*>::copy
                       (&typeParams.super_SmallVectorBase<const_slang::ast::Type_*>,
                        (EVP_PKEY_CTX *)pCVar18,(EVP_PKEY_CTX *)src_00._M_extent_value);
    typeParams_00._M_ptr._4_4_ = extraout_var_00;
    typeParams_00._M_ptr._0_4_ = iVar13;
    typeParams_00._M_extent._M_extent_value = extraout_RDX_04._M_extent_value;
    paramValues_00._M_extent._M_extent_value = src_00._M_extent_value;
    detail::ClassSpecializationKey::ClassSpecializationKey(&key,paramValues_00,typeParams_00);
    if (classType->isUninstantiated == true) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = key.savedHash;
      ptVar19 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
                 *)&pGVar17->uninstantiatedSpecMap;
      uVar23 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,8) ^
               SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,0);
      uVar15 = uVar23 >> ((byte)(pGVar17->uninstantiatedSpecMap).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      lVar16 = (uVar23 & 0xff) * 4;
      uVar28 = (&UNK_007e24cc)[lVar16];
      uVar29 = (&UNK_007e24cd)[lVar16];
      uVar30 = (&UNK_007e24ce)[lVar16];
      bVar31 = (&UNK_007e24cf)[lVar16];
      uVar20 = (ulong)((uint)uVar23 & 7);
      uVar21 = 0;
      uVar22 = uVar15;
      uVar32 = uVar28;
      uVar33 = uVar29;
      uVar34 = uVar30;
      bVar35 = bVar31;
      uVar36 = uVar28;
      uVar37 = uVar29;
      uVar38 = uVar30;
      bVar39 = bVar31;
      uVar40 = uVar28;
      uVar41 = uVar29;
      uVar42 = uVar30;
      bVar43 = bVar31;
      do {
        pgVar4 = (pGVar17->uninstantiatedSpecMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                 .arrays.groups_;
        pgVar1 = pgVar4 + uVar22;
        local_268 = pgVar1->m[0].n;
        uStack_267 = pgVar1->m[1].n;
        uStack_266 = pgVar1->m[2].n;
        bStack_265 = pgVar1->m[3].n;
        uStack_264 = pgVar1->m[4].n;
        uStack_263 = pgVar1->m[5].n;
        uStack_262 = pgVar1->m[6].n;
        bStack_261 = pgVar1->m[7].n;
        uStack_260 = pgVar1->m[8].n;
        uStack_25f = pgVar1->m[9].n;
        uStack_25e = pgVar1->m[10].n;
        bStack_25d = pgVar1->m[0xb].n;
        uStack_25c = pgVar1->m[0xc].n;
        uStack_25b = pgVar1->m[0xd].n;
        uStack_25a = pgVar1->m[0xe].n;
        bVar11 = pgVar1->m[0xf].n;
        auVar26[0] = -(local_268 == uVar28);
        auVar26[1] = -(uStack_267 == uVar29);
        auVar26[2] = -(uStack_266 == uVar30);
        auVar26[3] = -(bStack_265 == bVar31);
        auVar26[4] = -(uStack_264 == uVar32);
        auVar26[5] = -(uStack_263 == uVar33);
        auVar26[6] = -(uStack_262 == uVar34);
        auVar26[7] = -(bStack_261 == bVar35);
        auVar26[8] = -(uStack_260 == uVar36);
        auVar26[9] = -(uStack_25f == uVar37);
        auVar26[10] = -(uStack_25e == uVar38);
        auVar26[0xb] = -(bStack_25d == bVar39);
        auVar26[0xc] = -(uStack_25c == uVar40);
        auVar26[0xd] = -(uStack_25b == uVar41);
        auVar26[0xe] = -(uStack_25a == uVar42);
        auVar26[0xf] = -(bVar11 == bVar43);
        uVar12 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
        bStack_259 = bVar11;
        if (uVar12 != 0) {
          local_2c8._0_2_ = CONCAT11(uVar29,uVar28);
          local_2c8._0_3_ = CONCAT12(uVar30,(undefined2)local_2c8);
          local_2c8._0_4_ = CONCAT13(bVar31,(undefined3)local_2c8);
          local_2c8._0_5_ = CONCAT14(uVar32,(undefined4)local_2c8);
          local_2c8._0_6_ = CONCAT15(uVar33,(undefined5)local_2c8);
          local_2c8._0_7_ = CONCAT16(uVar34,(undefined6)local_2c8);
          local_2c8 = (ParameterValueAssignmentSyntax *)CONCAT17(bVar35,(undefined7)local_2c8);
          ppVar5 = (pGVar17->uninstantiatedSpecMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                   .arrays.elements_;
          local_2f8 = ptVar19;
          local_2f0 = uVar23;
          local_2e8 = uVar15;
          local_2e0 = uVar22;
          local_2d8 = uVar21;
          local_2d0 = uVar20;
          uStack_2c0 = uVar36;
          uStack_2bf = uVar37;
          uStack_2be = uVar38;
          bStack_2bd = bVar39;
          uStack_2bc = uVar40;
          uStack_2bb = uVar41;
          uStack_2ba = uVar42;
          bStack_2b9 = bVar43;
          do {
            uVar7 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            pCVar24 = (Compilation *)(ppVar5 + uVar22 * 0xf + (ulong)uVar7);
            pCVar18 = pCVar24;
            bVar10 = detail::ClassSpecializationKey::operator==
                               (&key,(ClassSpecializationKey *)pCVar24);
            if (bVar10) goto LAB_0064a301;
            uVar12 = uVar12 - 1 & uVar12;
          } while (uVar12 != 0);
          bVar11 = pgVar4[uVar22].m[0xf].n;
          uVar15 = local_2e8;
          ptVar19 = local_2f8;
          uVar20 = local_2d0;
          uVar21 = local_2d8;
          uVar22 = local_2e0;
          uVar23 = local_2f0;
          uVar28 = (uchar)local_2c8;
          uVar29 = local_2c8._1_1_;
          uVar30 = local_2c8._2_1_;
          bVar31 = local_2c8._3_1_;
          uVar32 = local_2c8._4_1_;
          uVar33 = local_2c8._5_1_;
          uVar34 = local_2c8._6_1_;
          bVar35 = local_2c8._7_1_;
          uVar36 = uStack_2c0;
          uVar37 = uStack_2bf;
          uVar38 = uStack_2be;
          bVar39 = bStack_2bd;
          uVar40 = uStack_2bc;
          uVar41 = uStack_2bb;
          uVar42 = uStack_2ba;
          bVar43 = bStack_2b9;
        }
        this = local_308;
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[uVar20] & bVar11) == 0) break;
        uVar6 = (local_308->uninstantiatedSpecMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                .arrays.groups_size_mask;
        lVar16 = uVar22 + uVar21;
        uVar21 = uVar21 + 1;
        uVar22 = lVar16 + 1U & uVar6;
        pGVar17 = local_308;
      } while (uVar21 <= uVar6);
      if ((local_308->uninstantiatedSpecMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
          .size_ctrl.size <
          (local_308->uninstantiatedSpecMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
          .size_ctrl.ml) {
        in_stack_fffffffffffffcd8 = (SourceLocation)&classType;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (&local_280,ptVar19,uVar15,uVar23,&local_311,&key,
                   (ClassType **)in_stack_fffffffffffffcd8);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (&local_280,ptVar19,uVar23,&local_311,&key,&classType);
      }
    }
    else {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = key.savedHash;
      ptVar19 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
                 *)&pGVar17->specMap;
      uVar23 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar9,8) ^
               SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar9,0);
      uVar15 = uVar23 >> ((byte)(pGVar17->specMap).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      lVar16 = (uVar23 & 0xff) * 4;
      uVar28 = (&UNK_007e24cc)[lVar16];
      uVar29 = (&UNK_007e24cd)[lVar16];
      uVar30 = (&UNK_007e24ce)[lVar16];
      bVar31 = (&UNK_007e24cf)[lVar16];
      uVar20 = (ulong)((uint)uVar23 & 7);
      uVar21 = 0;
      uVar22 = uVar15;
      uVar32 = uVar28;
      uVar33 = uVar29;
      uVar34 = uVar30;
      bVar35 = bVar31;
      uVar36 = uVar28;
      uVar37 = uVar29;
      uVar38 = uVar30;
      bVar39 = bVar31;
      uVar40 = uVar28;
      uVar41 = uVar29;
      uVar42 = uVar30;
      bVar43 = bVar31;
      do {
        pgVar4 = (pGVar17->specMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                 .arrays.groups_;
        pgVar1 = pgVar4 + uVar22;
        local_258 = pgVar1->m[0].n;
        uStack_257 = pgVar1->m[1].n;
        uStack_256 = pgVar1->m[2].n;
        bStack_255 = pgVar1->m[3].n;
        uStack_254 = pgVar1->m[4].n;
        uStack_253 = pgVar1->m[5].n;
        uStack_252 = pgVar1->m[6].n;
        bStack_251 = pgVar1->m[7].n;
        uStack_250 = pgVar1->m[8].n;
        uStack_24f = pgVar1->m[9].n;
        uStack_24e = pgVar1->m[10].n;
        bStack_24d = pgVar1->m[0xb].n;
        uStack_24c = pgVar1->m[0xc].n;
        uStack_24b = pgVar1->m[0xd].n;
        uStack_24a = pgVar1->m[0xe].n;
        bVar11 = pgVar1->m[0xf].n;
        auVar27[0] = -(local_258 == uVar28);
        auVar27[1] = -(uStack_257 == uVar29);
        auVar27[2] = -(uStack_256 == uVar30);
        auVar27[3] = -(bStack_255 == bVar31);
        auVar27[4] = -(uStack_254 == uVar32);
        auVar27[5] = -(uStack_253 == uVar33);
        auVar27[6] = -(uStack_252 == uVar34);
        auVar27[7] = -(bStack_251 == bVar35);
        auVar27[8] = -(uStack_250 == uVar36);
        auVar27[9] = -(uStack_24f == uVar37);
        auVar27[10] = -(uStack_24e == uVar38);
        auVar27[0xb] = -(bStack_24d == bVar39);
        auVar27[0xc] = -(uStack_24c == uVar40);
        auVar27[0xd] = -(uStack_24b == uVar41);
        auVar27[0xe] = -(uStack_24a == uVar42);
        auVar27[0xf] = -(bVar11 == bVar43);
        uVar12 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
        bStack_249 = bVar11;
        if (uVar12 != 0) {
          local_2c8._0_2_ = CONCAT11(uVar29,uVar28);
          local_2c8._0_3_ = CONCAT12(uVar30,(undefined2)local_2c8);
          local_2c8._0_4_ = CONCAT13(bVar31,(undefined3)local_2c8);
          local_2c8._0_5_ = CONCAT14(uVar32,(undefined4)local_2c8);
          local_2c8._0_6_ = CONCAT15(uVar33,(undefined5)local_2c8);
          local_2c8._0_7_ = CONCAT16(uVar34,(undefined6)local_2c8);
          local_2c8 = (ParameterValueAssignmentSyntax *)CONCAT17(bVar35,(undefined7)local_2c8);
          ppVar5 = (pGVar17->specMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                   .arrays.elements_;
          local_2f8 = ptVar19;
          local_2f0 = uVar23;
          local_2e8 = uVar15;
          local_2e0 = uVar22;
          local_2d8 = uVar21;
          local_2d0 = uVar20;
          uStack_2c0 = uVar36;
          uStack_2bf = uVar37;
          uStack_2be = uVar38;
          bStack_2bd = bVar39;
          uStack_2bc = uVar40;
          uStack_2bb = uVar41;
          uStack_2ba = uVar42;
          bStack_2b9 = bVar43;
          do {
            uVar7 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            pCVar24 = (Compilation *)(ppVar5 + uVar22 * 0xf + (ulong)uVar7);
            pCVar18 = pCVar24;
            bVar10 = detail::ClassSpecializationKey::operator==
                               (&key,(ClassSpecializationKey *)pCVar24);
            if (bVar10) goto LAB_0064a301;
            uVar12 = uVar12 - 1 & uVar12;
          } while (uVar12 != 0);
          bVar11 = pgVar4[uVar22].m[0xf].n;
          uVar15 = local_2e8;
          ptVar19 = local_2f8;
          uVar20 = local_2d0;
          uVar21 = local_2d8;
          uVar22 = local_2e0;
          uVar23 = local_2f0;
          uVar28 = (uchar)local_2c8;
          uVar29 = local_2c8._1_1_;
          uVar30 = local_2c8._2_1_;
          bVar31 = local_2c8._3_1_;
          uVar32 = local_2c8._4_1_;
          uVar33 = local_2c8._5_1_;
          uVar34 = local_2c8._6_1_;
          bVar35 = local_2c8._7_1_;
          uVar36 = uStack_2c0;
          uVar37 = uStack_2bf;
          uVar38 = uStack_2be;
          bVar39 = bStack_2bd;
          uVar40 = uStack_2bc;
          uVar41 = uStack_2bb;
          uVar42 = uStack_2ba;
          bVar43 = bStack_2b9;
        }
        this = local_308;
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[uVar20] & bVar11) == 0) break;
        uVar6 = (local_308->specMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                .arrays.groups_size_mask;
        lVar16 = uVar22 + uVar21;
        uVar21 = uVar21 + 1;
        uVar22 = lVar16 + 1U & uVar6;
        pGVar17 = local_308;
      } while (uVar21 <= uVar6);
      if ((local_308->specMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
          .size_ctrl.size <
          (local_308->specMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
          .size_ctrl.ml) {
        in_stack_fffffffffffffcd8 = (SourceLocation)&classType;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (&local_280,ptVar19,uVar15,uVar23,&local_311,&key,
                   (ClassType **)in_stack_fffffffffffffcd8);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (&local_280,ptVar19,uVar23,&local_311,&key,&classType);
      }
    }
  }
  p_Var3 = (this->specializeFunc).callback;
  if (p_Var3 == (_func_void_intptr_t_Compilation_ptr_ClassType_ptr_SourceLocation *)0x0) {
    pCVar18 = local_2b0;
    ClassType::populate(classType,(Scope *)local_2b0,
                        (ClassDeclarationSyntax *)(this->super_Symbol).originatingSyntax);
    pCVar25 = classType;
  }
  else {
    pCVar18 = local_300;
    (*p_Var3)((this->specializeFunc).callable,local_300,classType,in_stack_fffffffffffffcd8);
    pCVar25 = classType;
  }
  goto LAB_0064a30a;
LAB_0064a301:
  this = local_308;
  pCVar25 = (ClassType *)
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
            &(pCVar24->options).maxConstexprBacktrace)->_M_ptr;
LAB_0064a30a:
  SmallVectorBase<const_slang::ast::Type_*>::cleanup
            (&typeParams.super_SmallVectorBase<const_slang::ast::Type_*>,(EVP_PKEY_CTX *)pCVar18);
  SmallVectorBase<const_slang::ConstantValue_*>::cleanup
            (&paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>,
             (EVP_PKEY_CTX *)pCVar18);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                 *)&paramBuilder.assignments.super_Storage.field_0x108);
LAB_0064a331:
  this->recursionDepth = this->recursionDepth - 1;
  return &pCVar25->super_Type;
}

Assistant:

const Type* GenericClassDefSymbol::getSpecializationImpl(
    const ASTContext& context, SourceLocation instanceLoc, bool forceInvalidParams,
    const ParameterValueAssignmentSyntax* syntax) const {

    auto& comp = context.getCompilation();
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto guard = ScopeGuard([this] { recursionDepth--; });
    if (++recursionDepth > comp.getOptions().maxRecursiveClassSpecialization) {
        context.addDiag(diag::RecursiveClassSpecialization, instanceLoc) << name;
        return &comp.getErrorType();
    }

    // Create a class type instance to hold the parameters. If it turns out we already
    // have this specialization cached we'll throw it away, but that's not a big deal.
    auto classType = comp.emplace<ClassType>(comp, name, location);
    classType->genericClass = this;
    classType->isUninstantiated = forceInvalidParams || context.scope->isUninstantiated();
    classType->setParent(*scope, getIndex());

    // If this is for the default specialization, `syntax` will be null.
    // We want to suppress errors about params not having values and just
    // return null so that the caller can figure out if this is actually a problem.
    const bool isForDefault = syntax == nullptr;

    ParameterBuilder paramBuilder(*context.scope, name, paramDecls);
    paramBuilder.setForceInvalidValues(forceInvalidParams);
    paramBuilder.setSuppressErrors(isForDefault);
    paramBuilder.setInstanceContext(context);
    if (syntax)
        paramBuilder.setAssignments(*syntax, /* isFromConfig */ false);

    SourceRange instRange = {instanceLoc, instanceLoc + 1};

    SmallVector<const ConstantValue*> paramValues;
    SmallVector<const Type*> typeParams;
    for (auto& decl : paramDecls) {
        auto& param = paramBuilder.createParam(decl, *classType, instanceLoc);
        if (paramBuilder.hasErrors()) {
            if (isForDefault)
                return nullptr;

            // Otherwise use an error type instead.
            return &comp.getErrorType();
        }

        if (!param.isLocalParam()) {
            auto& sym = param.symbol;
            if (sym.kind == SymbolKind::Parameter) {
                auto& ps = sym.as<ParameterSymbol>();
                paramValues.push_back(&ps.getValue(instRange));
            }
            else {
                auto& tps = sym.as<TypeParameterSymbol>();
                typeParams.push_back(&tps.targetType.getType());
            }
        }
    }

    if (!forceInvalidParams) {
        detail::ClassSpecializationKey key(paramValues.copy(comp), typeParams.copy(comp));
        if (classType->isUninstantiated) {
            // If we're in an uninstantiated scope we save this specialization
            // in a separate map so that we don't try to elaborate it further
            // and potentially cause spurious errors to be issued.
            auto [it, inserted] = uninstantiatedSpecMap.emplace(key, classType);
            if (!inserted)
                return it->second;
        }
        else {
            auto [it, inserted] = specMap.emplace(key, classType);
            if (!inserted)
                return it->second;
        }
    }

    // Not found, so this is a new entry. Fill in its members and store the
    // specialization for later lookup. If we have a specialization function,
    // call that instead of trying to create from our syntax node.
    if (specializeFunc)
        specializeFunc(comp, *classType, instanceLoc);
    else
        classType->populate(*scope, getSyntax()->as<ClassDeclarationSyntax>());

    return classType;
}